

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O1

int run_test_udp_open_twice(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  undefined8 uVar5;
  ulong uVar6;
  long *plVar7;
  int64_t eval_b;
  int64_t eval_a;
  uv_udp_t client;
  long lStack_610;
  long lStack_608;
  undefined1 auStack_600 [16];
  sockaddr sStack_5f0;
  undefined2 uStack_5e0;
  undefined1 uStack_5de;
  undefined5 uStack_5dd;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 uStack_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_5a0;
  undefined6 uStack_598;
  undefined2 uStack_592;
  undefined6 uStack_590;
  undefined8 uStack_58a;
  undefined8 auStack_578 [23];
  long alStack_4c0 [41];
  ulong uStack_378;
  code *pcStack_370;
  long lStack_368;
  long lStack_360;
  undefined1 auStack_358 [16];
  sockaddr sStack_348;
  long alStack_338 [23];
  long alStack_280 [8];
  long lStack_240;
  code *pcStack_1c8;
  long lStack_1b8;
  long lStack_1b0;
  sockaddr sStack_1a8;
  long alStack_198 [23];
  code *pcStack_e0;
  long local_d8;
  long local_d0;
  undefined1 local_c8 [184];
  
  pcStack_e0 = (code *)0x1df28e;
  uVar1 = create_udp_socket();
  pcStack_e0 = (code *)0x1df295;
  uVar2 = create_udp_socket();
  uVar6 = (ulong)uVar2;
  pcStack_e0 = (code *)0x1df29c;
  uVar5 = uv_default_loop();
  pcStack_e0 = (code *)0x1df2a9;
  iVar3 = uv_udp_init(uVar5,local_c8);
  local_d0 = (long)iVar3;
  local_d8 = 0;
  if (local_d0 == 0) {
    pcStack_e0 = (code *)0x1df2d3;
    iVar3 = uv_udp_open(local_c8,uVar1);
    local_d0 = (long)iVar3;
    local_d8 = 0;
    if (local_d0 != 0) goto LAB_001df3c3;
    pcStack_e0 = (code *)0x1df2fd;
    iVar3 = uv_udp_open(local_c8,uVar2);
    local_d0 = (long)iVar3;
    local_d8 = -0x10;
    if (local_d0 != -0x10) goto LAB_001df3d0;
    pcStack_e0 = (code *)0x1df322;
    iVar3 = close(uVar2);
    local_d0 = (long)iVar3;
    local_d8 = 0;
    if (local_d0 != 0) goto LAB_001df3dd;
    pcStack_e0 = (code *)0x1df34c;
    uv_close(local_c8,0);
    pcStack_e0 = (code *)0x1df351;
    uVar5 = uv_default_loop();
    pcStack_e0 = (code *)0x1df35b;
    uv_run(uVar5,0);
    pcStack_e0 = (code *)0x1df360;
    uVar6 = uv_default_loop();
    pcStack_e0 = (code *)0x1df374;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_e0 = (code *)0x1df37e;
    uv_run(uVar6,0);
    local_d0 = 0;
    pcStack_e0 = (code *)0x1df38c;
    uVar5 = uv_default_loop();
    pcStack_e0 = (code *)0x1df394;
    iVar3 = uv_loop_close(uVar5);
    local_d8 = (long)iVar3;
    if (local_d0 == local_d8) {
      pcStack_e0 = (code *)0x1df3aa;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_e0 = (code *)0x1df3c3;
    run_test_udp_open_twice_cold_1();
LAB_001df3c3:
    pcStack_e0 = (code *)0x1df3d0;
    run_test_udp_open_twice_cold_2();
LAB_001df3d0:
    pcStack_e0 = (code *)0x1df3dd;
    run_test_udp_open_twice_cold_3();
LAB_001df3dd:
    pcStack_e0 = (code *)0x1df3ea;
    run_test_udp_open_twice_cold_4();
  }
  pcStack_e0 = run_test_udp_open_bound;
  run_test_udp_open_twice_cold_5();
  pcStack_1c8 = (code *)0x1df415;
  pcStack_e0 = (code *)uVar6;
  iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_1a8);
  alStack_198[0] = (long)iVar3;
  lStack_1b8 = 0;
  if (alStack_198[0] == 0) {
    pcStack_1c8 = (code *)0x1df43a;
    uVar2 = create_udp_socket();
    uVar6 = (ulong)uVar2;
    pcStack_1c8 = (code *)0x1df44d;
    iVar3 = bind(uVar2,&sStack_1a8,0x10);
    alStack_198[0] = (long)iVar3;
    lStack_1b8 = 0;
    if (alStack_198[0] != 0) goto LAB_001df589;
    pcStack_1c8 = (code *)0x1df472;
    uVar5 = uv_default_loop();
    pcStack_1c8 = (code *)0x1df47f;
    iVar3 = uv_udp_init(uVar5,alStack_198);
    lStack_1b8 = (long)iVar3;
    lStack_1b0 = 0;
    if (lStack_1b8 != 0) goto LAB_001df598;
    pcStack_1c8 = (code *)0x1df4ab;
    iVar3 = uv_udp_open(alStack_198,uVar2);
    lStack_1b8 = (long)iVar3;
    lStack_1b0 = 0;
    if (lStack_1b8 != 0) goto LAB_001df5a7;
    pcStack_1c8 = (code *)0x1df4e3;
    iVar3 = uv_udp_recv_start(alStack_198,alloc_cb,recv_cb);
    lStack_1b8 = (long)iVar3;
    lStack_1b0 = 0;
    if (lStack_1b8 != 0) goto LAB_001df5b6;
    pcStack_1c8 = (code *)0x1df50f;
    uv_close(alStack_198,0);
    pcStack_1c8 = (code *)0x1df514;
    uVar5 = uv_default_loop();
    pcStack_1c8 = (code *)0x1df51e;
    uv_run(uVar5,0);
    pcStack_1c8 = (code *)0x1df523;
    uVar6 = uv_default_loop();
    pcStack_1c8 = (code *)0x1df537;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_1c8 = (code *)0x1df541;
    uv_run(uVar6,0);
    lStack_1b8 = 0;
    pcStack_1c8 = (code *)0x1df54f;
    uVar5 = uv_default_loop();
    pcStack_1c8 = (code *)0x1df557;
    iVar3 = uv_loop_close(uVar5);
    lStack_1b0 = (long)iVar3;
    if (lStack_1b8 == lStack_1b0) {
      pcStack_1c8 = (code *)0x1df56f;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1c8 = (code *)0x1df589;
    run_test_udp_open_bound_cold_1();
LAB_001df589:
    pcStack_1c8 = (code *)0x1df598;
    run_test_udp_open_bound_cold_2();
LAB_001df598:
    pcStack_1c8 = (code *)0x1df5a7;
    run_test_udp_open_bound_cold_3();
LAB_001df5a7:
    pcStack_1c8 = (code *)0x1df5b6;
    run_test_udp_open_bound_cold_4();
LAB_001df5b6:
    pcStack_1c8 = (code *)0x1df5c5;
    run_test_udp_open_bound_cold_5();
  }
  pcStack_1c8 = run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_370 = (code *)0x1df5ed;
  pcStack_1c8 = (code *)uVar6;
  auStack_358 = uv_buf_init("PING",4);
  pcStack_370 = (code *)0x1df60d;
  iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_348);
  alStack_280[0] = (long)iVar3;
  alStack_338[0] = 0;
  if (alStack_280[0] == 0) {
    pcStack_370 = (code *)0x1df638;
    uVar2 = create_udp_socket();
    uVar6 = (ulong)uVar2;
    pcStack_370 = (code *)0x1df63f;
    uVar5 = uv_default_loop();
    pcStack_370 = (code *)0x1df64f;
    iVar3 = uv_udp_init(uVar5,alStack_280);
    alStack_338[0] = (long)iVar3;
    lStack_368 = 0;
    if (alStack_338[0] != 0) goto LAB_001df88d;
    pcStack_370 = (code *)0x1df67e;
    iVar3 = connect(uVar2,&sStack_348,0x10);
    alStack_338[0] = (long)iVar3;
    lStack_368 = 0;
    if (alStack_338[0] != 0) goto LAB_001df89a;
    pcStack_370 = (code *)0x1df6ab;
    iVar3 = uv_udp_open(alStack_280,uVar2);
    alStack_338[0] = (long)iVar3;
    lStack_368 = 0;
    if (alStack_338[0] != 0) goto LAB_001df8a7;
    pcStack_370 = (code *)0x1df6ce;
    uVar5 = uv_default_loop();
    pcStack_370 = (code *)0x1df6db;
    iVar3 = uv_udp_init(uVar5,alStack_338);
    lStack_368 = (long)iVar3;
    lStack_360 = 0;
    if (lStack_368 != 0) goto LAB_001df8b4;
    pcStack_370 = (code *)0x1df70a;
    iVar3 = uv_udp_bind(alStack_338,&sStack_348,0);
    lStack_368 = (long)iVar3;
    lStack_360 = 0;
    if (lStack_368 != 0) goto LAB_001df8c1;
    pcStack_370 = (code *)0x1df740;
    iVar3 = uv_udp_recv_start(alStack_338,alloc_cb,recv_cb);
    lStack_368 = (long)iVar3;
    lStack_360 = 0;
    if (lStack_368 != 0) goto LAB_001df8ce;
    pcStack_370 = (code *)0x1df786;
    iVar3 = uv_udp_send(&send_req,alStack_280,auStack_358,1,0,send_cb);
    lStack_368 = (long)iVar3;
    lStack_360 = 0;
    if (lStack_368 != 0) goto LAB_001df8db;
    pcStack_370 = (code *)0x1df7a9;
    uVar5 = uv_default_loop();
    pcStack_370 = (code *)0x1df7b3;
    uv_run(uVar5,0);
    lStack_368 = 1;
    lStack_360 = (long)send_cb_called;
    if (lStack_360 != 1) goto LAB_001df8e8;
    lStack_368 = 2;
    lStack_360 = (long)close_cb_called;
    if (lStack_360 != 2) goto LAB_001df8f5;
    lStack_368 = lStack_240;
    lStack_360 = 0;
    if (lStack_240 != 0) goto LAB_001df902;
    pcStack_370 = (code *)0x1df822;
    uVar6 = uv_default_loop();
    pcStack_370 = (code *)0x1df836;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_370 = (code *)0x1df840;
    uv_run(uVar6,0);
    lStack_368 = 0;
    pcStack_370 = (code *)0x1df84d;
    uVar5 = uv_default_loop();
    pcStack_370 = (code *)0x1df855;
    iVar3 = uv_loop_close(uVar5);
    lStack_360 = (long)iVar3;
    if (lStack_368 == lStack_360) {
      pcStack_370 = (code *)0x1df870;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_370 = (code *)0x1df88d;
    run_test_udp_open_connect_cold_1();
LAB_001df88d:
    pcStack_370 = (code *)0x1df89a;
    run_test_udp_open_connect_cold_2();
LAB_001df89a:
    pcStack_370 = (code *)0x1df8a7;
    run_test_udp_open_connect_cold_3();
LAB_001df8a7:
    pcStack_370 = (code *)0x1df8b4;
    run_test_udp_open_connect_cold_4();
LAB_001df8b4:
    pcStack_370 = (code *)0x1df8c1;
    run_test_udp_open_connect_cold_5();
LAB_001df8c1:
    pcStack_370 = (code *)0x1df8ce;
    run_test_udp_open_connect_cold_6();
LAB_001df8ce:
    pcStack_370 = (code *)0x1df8db;
    run_test_udp_open_connect_cold_7();
LAB_001df8db:
    pcStack_370 = (code *)0x1df8e8;
    run_test_udp_open_connect_cold_8();
LAB_001df8e8:
    pcStack_370 = (code *)0x1df8f5;
    run_test_udp_open_connect_cold_9();
LAB_001df8f5:
    pcStack_370 = (code *)0x1df902;
    run_test_udp_open_connect_cold_10();
LAB_001df902:
    pcStack_370 = (code *)0x1df90f;
    run_test_udp_open_connect_cold_11();
  }
  pcStack_370 = run_test_udp_send_unix;
  run_test_udp_open_connect_cold_12();
  plVar7 = &lStack_610;
  uStack_378 = uVar6;
  pcStack_370 = (code *)(ulong)uVar1;
  auStack_600 = uv_buf_init("PING",4);
  uVar5 = uv_default_loop();
  uStack_5dd = 0;
  uStack_5d8 = 0;
  uStack_5d0 = 0;
  uStack_5c8 = 0;
  uStack_5c0 = 0;
  uStack_5b8 = 0;
  uStack_5b0 = 0;
  uStack_5a8 = 0;
  uStack_5a0 = 0;
  uStack_598 = 0;
  uStack_592 = 0;
  uStack_590 = 0;
  uStack_58a = 0;
  sStack_5f0.sa_family = 1;
  alStack_4c0[0] = 0x11;
  auStack_578[0] = 0x6c;
  builtin_strncpy(sStack_5f0.sa_data,"/tmp/uv-test-s",0xe);
  uStack_5e0 = 0x636f;
  uStack_5de = 0x6b;
  iVar3 = socket(1,1,0);
  alStack_4c0[0] = (long)iVar3;
  auStack_578[0] = 0;
  if (alStack_4c0[0] < 0) {
    auStack_578[0] = 0;
    run_test_udp_send_unix_cold_8();
LAB_001dfbd2:
    run_test_udp_send_unix_cold_2();
LAB_001dfbe7:
    run_test_udp_send_unix_cold_3();
LAB_001dfbfc:
    run_test_udp_send_unix_cold_4();
LAB_001dfc0c:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    iVar4 = bind(iVar3,&sStack_5f0,0x6e);
    alStack_4c0[0] = (long)iVar4;
    auStack_578[0] = 0;
    if (alStack_4c0[0] != 0) goto LAB_001dfbd2;
    iVar4 = listen(iVar3,1);
    alStack_4c0[0] = (long)iVar4;
    auStack_578[0] = 0;
    if (alStack_4c0[0] != 0) goto LAB_001dfbe7;
    iVar4 = uv_udp_init(uVar5,auStack_578);
    alStack_4c0[0] = (long)iVar4;
    lStack_610 = 0;
    if (alStack_4c0[0] != 0) goto LAB_001dfbfc;
    iVar4 = uv_udp_open(auStack_578,iVar3);
    alStack_4c0[0] = (long)iVar4;
    lStack_610 = 0;
    if (alStack_4c0[0] != 0) goto LAB_001dfc0c;
    uv_run(uVar5,0);
    iVar4 = uv_udp_send(alStack_4c0,auStack_578,auStack_600,1,&sStack_5f0,0);
    lStack_610 = (long)iVar4;
    lStack_608 = 0;
    if (lStack_610 == 0) {
      uv_close(auStack_578,0);
      uv_run(uVar5,0);
      close(iVar3);
      unlink("/tmp/uv-test-sock");
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      lStack_610 = 0;
      iVar3 = uv_loop_close(uVar5);
      lStack_608 = (long)iVar3;
      if (lStack_610 == lStack_608) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001dfc29;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_001dfc29:
  run_test_udp_send_unix_cold_7();
  if (plVar7 != (long *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  close_cb_cold_1();
  iVar3 = uv_is_closing();
  if (iVar3 == 0) {
    iVar3 = uv_close(plVar7,0);
    return iVar3;
  }
  return iVar3;
}

Assistant:

TEST_IMPL(udp_open_twice) {
  uv_udp_t client;
  uv_os_sock_t sock1, sock2;
  int r;

  startup();
  sock1 = create_udp_socket();
  sock2 = create_udp_socket();

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_udp_open(&client, sock1);
  ASSERT_OK(r);

  r = uv_udp_open(&client, sock2);
  ASSERT_EQ(r, UV_EBUSY);
  close_socket(sock2);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}